

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O3

void bitset_print(bitset_t *b)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  putchar(0x7b);
  uVar1 = b->arraysize;
  if (uVar1 != 0) {
    uVar3 = 0;
    uVar6 = 0;
    do {
      uVar4 = b->array[uVar3] >> ((byte)uVar6 & 0x3f);
      if (uVar4 == 0) {
        lVar2 = uVar3 * -0x40;
        do {
          uVar3 = uVar3 + 1;
          if (uVar1 == uVar3) goto LAB_00112ba7;
          uVar6 = b->array[uVar3];
          lVar2 = lVar2 + -0x40;
        } while (uVar6 == 0);
        lVar5 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        lVar5 = lVar5 - lVar2;
      }
      else {
        lVar5 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        lVar5 = uVar6 + lVar5;
      }
      printf("%zu, ",lVar5);
      uVar6 = lVar5 + 1;
      uVar3 = uVar6 >> 6;
      uVar1 = b->arraysize;
    } while (uVar3 < uVar1);
  }
LAB_00112ba7:
  putchar(0x7d);
  return;
}

Assistant:

inline void bitset_print(const bitset_t *b) {
    printf("{");
    for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
        printf("%zu, ", i);
    }
    printf("}");
}